

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLTest_InternalSessionCache_Test::TestBody
          (SSLTest_InternalSessionCache_Test *this)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  _Head_base<0UL,_ssl_ctx_st_*,_false> _Var3;
  int iVar4;
  SSL_METHOD *meth;
  uint32_t number;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  _Head_base<0UL,_ssl_session_st_*,_false> *this_00;
  char *in_R9;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar6;
  undefined1 auVar7 [8];
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  initializer_list<ssl_session_st_*> __l;
  initializer_list<ssl_session_st_*> __l_00;
  initializer_list<ssl_session_st_*> __l_01;
  initializer_list<ssl_session_st_*> __l_02;
  initializer_list<ssl_session_st_*> __l_03;
  UniquePtr<SSL_SESSION> session;
  UniquePtr<SSL_SESSION> collision;
  UniquePtr<SSL_CTX> ctx;
  vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
  sessions;
  AssertHelper local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  pointer local_88;
  _Head_base<0UL,_ssl_session_st_*,_false> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  _Head_base<0UL,_ssl_session_st_*,_false> local_70;
  undefined1 local_68 [32];
  ssl_session_st *local_48;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_40;
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_30;
  pointer local_28;
  
  meth = (SSL_METHOD *)TLS_method();
  local_40._M_head_impl = (ssl_ctx_st *)SSL_CTX_new(meth);
  local_38[0] = local_40._M_head_impl != (SSL_CTX *)0x0;
  pbStack_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_40._M_head_impl == (SSL_CTX *)0x0) {
    testing::Message::Message((Message *)local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_38,(AssertionResult *)0x336329,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xa66,(char *)local_68._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((SSL_SESSION *)local_68._0_8_ != (SSL_SESSION *)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    if ((long *)CONCAT71(local_98._1_7_,local_98[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_98._1_7_,local_98[0]) + 8))();
    }
    if (pbStack_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_38 + 8),pbStack_30);
    }
    goto LAB_0016f6e2;
  }
  _local_38 = (undefined1  [16])0x0;
  local_28 = (pointer)0x0;
  number = 0;
  do {
    CreateTestSession((anon_unknown_0 *)&local_80,number);
    bVar8 = CONCAT71(local_80._M_head_impl._1_7_,local_80._M_head_impl._0_1_) == 0;
    local_98[0] = (internal)!bVar8;
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar8) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)local_98,(AssertionResult *)0x34e814,"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xa6c,(char *)local_68._0_8_);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((SSL_SESSION *)local_68._0_8_ != (SSL_SESSION *)(local_68 + 0x10)) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      if ((SSL_SESSION *)local_70._M_head_impl != (SSL_SESSION *)0x0) {
        (**(code **)(*(long *)local_70._M_head_impl + 8))();
      }
      if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_90,local_90);
      }
      this_00 = &local_80;
      goto LAB_0016f586;
    }
    std::
    vector<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>,std::allocator<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>>
    ::emplace_back<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
              ((vector<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>,std::allocator<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>>
                *)local_38,(unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_80);
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_80);
    number = number + 1;
  } while (number != 10);
  SSL_CTX_sess_set_cache_size(local_40._M_head_impl,5);
  pbVar5 = pbStack_30;
  auVar7 = local_38;
  if (local_38 != (undefined1  [8])pbStack_30) {
    do {
      iVar4 = SSL_CTX_add_session((SSL_CTX *)local_40._M_head_impl,
                                  (SSL_SESSION *)
                                  (((pointer)auVar7)->_M_t).
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
      local_98[0] = (internal)(iVar4 != 0);
      local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)&local_80);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_68,(internal *)local_98,
                   (AssertionResult *)"SSL_CTX_add_session(ctx.get(), session.get())","false","true"
                   ,in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xa74,(char *)local_68._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_80);
        goto LAB_0016f5ed;
      }
      auVar7 = (undefined1  [8])((long)auVar7 + 8);
    } while (auVar7 != (undefined1  [8])pbVar5);
  }
  _Var3._M_head_impl = local_40._M_head_impl;
  auVar1 = *(undefined1 (*) [16])((long)local_38 + 0x40);
  auVar9._0_8_ = auVar1._8_8_;
  auVar9._8_4_ = auVar1._0_4_;
  auVar9._12_4_ = auVar1._4_4_;
  local_68._8_8_ = auVar9._8_8_;
  auVar1 = *(undefined1 (*) [16])((long)local_38 + 0x30);
  auVar10._0_8_ = auVar1._8_8_;
  auVar10._8_4_ = auVar1._0_4_;
  auVar10._12_4_ = auVar1._4_4_;
  local_68._24_8_ = auVar10._8_8_;
  local_48 = (((pointer)((long)local_38 + 0x28))->_M_t).
             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
  __l._M_len = 5;
  __l._M_array = (iterator)local_68;
  local_68._0_8_ = auVar9._0_8_;
  local_68._16_8_ = auVar10._0_8_;
  std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
            ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98,__l,
             (allocator_type *)&local_70);
  local_80._M_head_impl._0_1_ =
       (anon_unknown_0)
       CacheEquals(_Var3._M_head_impl,
                   (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pvVar2 = (void *)CONCAT71(local_98._1_7_,local_98[0]);
  if (pvVar2 == (void *)0x0) {
    if ((bool)local_80._M_head_impl._0_1_) goto LAB_0016f389;
LAB_0016f634:
    testing::Message::Message((Message *)local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)&local_80,
               (AssertionResult *)
               "CacheEquals( ctx.get(), {sessions[9].get(), sessions[8].get(), sessions[7].get(), sessions[6].get(), sessions[5].get()})"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xa7a,(char *)local_68._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)local_98);
LAB_0016f691:
    pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_78;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((SSL_SESSION *)local_68._0_8_ != (SSL_SESSION *)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    pbVar5 = local_78;
    if ((long *)CONCAT71(local_98._1_7_,local_98[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_98._1_7_,local_98[0]) + 8))();
      pbVar5 = local_78;
    }
LAB_0016f6cb:
    if (pbVar5 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(pdVar6,pbVar5);
    }
  }
  else {
    operator_delete(pvVar2,(long)local_88 - (long)pvVar2);
    if (((byte)local_80._M_head_impl._0_1_ & 1) == 0) goto LAB_0016f634;
LAB_0016f389:
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    iVar4 = SSL_CTX_add_session((SSL_CTX *)local_40._M_head_impl,
                                (SSL_SESSION *)
                                (((pointer)((long)local_38 + 0x38))->_M_t).
                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
    _Var3._M_head_impl = local_40._M_head_impl;
    local_98[0] = (internal)(iVar4 == 0);
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_98[0]) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)local_98,
                 (AssertionResult *)"SSL_CTX_add_session(ctx.get(), sessions[7].get())","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xa7e,(char *)local_68._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_80);
LAB_0016f5ed:
      pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_90;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
      if ((SSL_SESSION *)local_68._0_8_ != (SSL_SESSION *)(local_68 + 0x10)) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      pbVar5 = local_90;
      if ((long *)CONCAT71(local_80._M_head_impl._1_7_,local_80._M_head_impl._0_1_) != (long *)0x0)
      {
        (**(code **)(*(long *)CONCAT71(local_80._M_head_impl._1_7_,local_80._M_head_impl._0_1_) + 8)
        )();
        pbVar5 = local_90;
      }
      goto LAB_0016f6cb;
    }
    auVar1 = *(undefined1 (*) [16])((long)local_38 + 0x40);
    auVar11._0_8_ = auVar1._8_8_;
    auVar11._8_4_ = auVar1._0_4_;
    auVar11._12_4_ = auVar1._4_4_;
    local_68._8_8_ = auVar11._8_8_;
    auVar1 = *(undefined1 (*) [16])((long)local_38 + 0x30);
    auVar12._0_8_ = auVar1._8_8_;
    auVar12._8_4_ = auVar1._0_4_;
    auVar12._12_4_ = auVar1._4_4_;
    local_68._24_8_ = auVar12._8_8_;
    local_48 = (((pointer)((long)local_38 + 0x28))->_M_t).
               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
    __l_00._M_len = 5;
    __l_00._M_array = (iterator)local_68;
    local_68._0_8_ = auVar11._0_8_;
    local_68._16_8_ = auVar12._0_8_;
    std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
              ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98,__l_00,
               (allocator_type *)&local_70);
    local_80._M_head_impl._0_1_ =
         (anon_unknown_0)
         CacheEquals(_Var3._M_head_impl,
                     (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98);
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pvVar2 = (void *)CONCAT71(local_98._1_7_,local_98[0]);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,(long)local_88 - (long)pvVar2);
      if (((byte)local_80._M_head_impl._0_1_ & 1) != 0) goto LAB_0016f785;
LAB_0016f9d7:
      testing::Message::Message((Message *)local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)&local_80,
                 (AssertionResult *)
                 "CacheEquals( ctx.get(), {sessions[9].get(), sessions[8].get(), sessions[7].get(), sessions[6].get(), sessions[5].get()})"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xa81,(char *)local_68._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)local_98);
      goto LAB_0016f691;
    }
    if (!(bool)local_80._M_head_impl._0_1_) goto LAB_0016f9d7;
LAB_0016f785:
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    CreateTestSession((anon_unknown_0 *)&local_70,7);
    local_98[0] = (internal)((SSL_SESSION *)local_70._M_head_impl != (SSL_SESSION *)0x0);
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((SSL_SESSION *)local_70._M_head_impl == (SSL_SESSION *)0x0) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)local_98,(AssertionResult *)"collision","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xa86,(char *)local_68._0_8_);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_80);
LAB_0016fbd3:
      pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_90;
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((SSL_SESSION *)local_68._0_8_ != (SSL_SESSION *)(local_68 + 0x10)) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      pbVar5 = local_90;
      if ((long *)CONCAT71(local_80._M_head_impl._1_7_,local_80._M_head_impl._0_1_) != (long *)0x0)
      {
        (**(code **)(*(long *)CONCAT71(local_80._M_head_impl._1_7_,local_80._M_head_impl._0_1_) + 8)
        )();
        pbVar5 = local_90;
      }
    }
    else {
      iVar4 = SSL_CTX_add_session((SSL_CTX *)local_40._M_head_impl,
                                  (SSL_SESSION *)local_70._M_head_impl);
      _Var3._M_head_impl = local_40._M_head_impl;
      local_98[0] = (internal)(iVar4 != 0);
      local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)&local_80);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_68,(internal *)local_98,
                   (AssertionResult *)"SSL_CTX_add_session(ctx.get(), collision.get())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xa87,(char *)local_68._0_8_);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_80);
        goto LAB_0016fbd3;
      }
      local_68._0_8_ = local_70._M_head_impl;
      auVar1 = *(undefined1 (*) [16])((long)local_38 + 0x40);
      auVar13._0_8_ = auVar1._8_8_;
      auVar13._8_4_ = auVar1._0_4_;
      auVar13._12_4_ = auVar1._4_4_;
      local_68._16_8_ = auVar13._8_8_;
      auVar1 = *(undefined1 (*) [16])((long)local_38 + 0x28);
      auVar14._0_8_ = auVar1._8_8_;
      auVar14._8_4_ = auVar1._0_4_;
      auVar14._12_4_ = auVar1._4_4_;
      local_48 = auVar14._8_8_;
      __l_01._M_len = 5;
      __l_01._M_array = (iterator)local_68;
      local_68._8_8_ = auVar13._0_8_;
      local_68._24_8_ = auVar14._0_8_;
      std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
                ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98,__l_01,
                 (allocator_type *)&local_a0);
      local_80._M_head_impl._0_1_ =
           (anon_unknown_0)
           CacheEquals(_Var3._M_head_impl,
                       (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98);
      local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pvVar2 = (void *)CONCAT71(local_98._1_7_,local_98[0]);
      if (pvVar2 == (void *)0x0) {
        if ((bool)local_80._M_head_impl._0_1_) goto LAB_0016f86e;
LAB_0016fb0f:
        testing::Message::Message((Message *)local_98);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_68,(internal *)&local_80,
                   (AssertionResult *)
                   "CacheEquals( ctx.get(), {collision.get(), sessions[9].get(), sessions[8].get(), sessions[6].get(), sessions[5].get()})"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xa8a,(char *)local_68._0_8_);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_98);
LAB_0016fc77:
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if ((SSL_SESSION *)local_68._0_8_ != (SSL_SESSION *)(local_68 + 0x10)) {
          operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
        }
        if ((long *)CONCAT71(local_98._1_7_,local_98[0]) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_98._1_7_,local_98[0]) + 8))();
        }
      }
      else {
        operator_delete(pvVar2,(long)local_88 - (long)pvVar2);
        if (((byte)local_80._M_head_impl._0_1_ & 1) == 0) goto LAB_0016fb0f;
LAB_0016f86e:
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_78,local_78);
        }
        iVar4 = SSL_CTX_remove_session
                          ((SSL_CTX *)local_40._M_head_impl,
                           (SSL_SESSION *)
                           (((pointer)((long)local_38 + 0x30))->_M_t).
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
        _Var3._M_head_impl = local_40._M_head_impl;
        local_98[0] = (internal)(iVar4 != 0);
        local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_80);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_68,(internal *)local_98,
                     (AssertionResult *)"SSL_CTX_remove_session(ctx.get(), sessions[6].get())",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xa8d,(char *)local_68._0_8_);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_80);
          goto LAB_0016fbd3;
        }
        local_68._0_8_ = local_70._M_head_impl;
        auVar1 = *(undefined1 (*) [16])((long)local_38 + 0x40);
        auVar15._0_8_ = auVar1._8_8_;
        auVar15._8_4_ = auVar1._0_4_;
        auVar15._12_4_ = auVar1._4_4_;
        local_68._16_8_ = auVar15._8_8_;
        local_68._24_8_ =
             (((pointer)((long)local_38 + 0x28))->_M_t).
             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
        __l_02._M_len = 4;
        __l_02._M_array = (iterator)local_68;
        local_68._8_8_ = auVar15._0_8_;
        std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
                  ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98,__l_02,
                   (allocator_type *)&local_a0);
        local_80._M_head_impl._0_1_ =
             (anon_unknown_0)
             CacheEquals(_Var3._M_head_impl,
                         (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98);
        local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        pvVar2 = (void *)CONCAT71(local_98._1_7_,local_98[0]);
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,(long)local_88 - (long)pvVar2);
          if (((byte)local_80._M_head_impl._0_1_ & 1) != 0) goto LAB_0016f92e;
LAB_0016fc1a:
          testing::Message::Message((Message *)local_98);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_68,(internal *)&local_80,
                     (AssertionResult *)
                     "CacheEquals(ctx.get(), {collision.get(), sessions[9].get(), sessions[8].get(), sessions[5].get()})"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xa8f,(char *)local_68._0_8_);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_98);
          goto LAB_0016fc77;
        }
        if (!(bool)local_80._M_head_impl._0_1_) goto LAB_0016fc1a;
LAB_0016f92e:
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_78,local_78);
        }
        iVar4 = SSL_CTX_remove_session
                          ((SSL_CTX *)local_40._M_head_impl,
                           (SSL_SESSION *)
                           (((__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true> *
                             )local_38)->
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
        local_98[0] = (internal)(iVar4 == 0);
        local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_98[0]) {
          testing::Message::Message((Message *)&local_80);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_68,(internal *)local_98,
                     (AssertionResult *)"SSL_CTX_remove_session(ctx.get(), sessions[0].get())",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xa92,(char *)local_68._0_8_);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_80);
          goto LAB_0016fbd3;
        }
        iVar4 = SSL_CTX_remove_session
                          ((SSL_CTX *)local_40._M_head_impl,
                           (SSL_SESSION *)
                           (((pointer)((long)local_38 + 0x38))->_M_t).
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
        _Var3._M_head_impl = local_40._M_head_impl;
        local_98[0] = (internal)(iVar4 == 0);
        local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_98[0]) {
          testing::Message::Message((Message *)&local_80);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_68,(internal *)local_98,
                     (AssertionResult *)"SSL_CTX_remove_session(ctx.get(), sessions[7].get())",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xa93,(char *)local_68._0_8_);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_80);
          goto LAB_0016fbd3;
        }
        local_68._0_8_ = local_70._M_head_impl;
        auVar1 = *(undefined1 (*) [16])((long)local_38 + 0x40);
        auVar16._0_8_ = auVar1._8_8_;
        auVar16._8_4_ = auVar1._0_4_;
        auVar16._12_4_ = auVar1._4_4_;
        local_68._16_8_ = auVar16._8_8_;
        local_68._24_8_ =
             (((pointer)((long)local_38 + 0x28))->_M_t).
             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
        __l_03._M_len = 4;
        __l_03._M_array = (iterator)local_68;
        local_68._8_8_ = auVar16._0_8_;
        std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
                  ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98,__l_03,
                   (allocator_type *)&local_a0);
        local_80._M_head_impl._0_1_ =
             (anon_unknown_0)
             CacheEquals(_Var3._M_head_impl,
                         (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98);
        local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        pvVar2 = (void *)CONCAT71(local_98._1_7_,local_98[0]);
        if (pvVar2 == (void *)0x0) {
          if (!(bool)local_80._M_head_impl._0_1_) goto LAB_0016fddf;
        }
        else {
          operator_delete(pvVar2,(long)local_88 - (long)pvVar2);
          if (((byte)local_80._M_head_impl._0_1_ & 1) == 0) {
LAB_0016fddf:
            testing::Message::Message((Message *)local_98);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_68,(internal *)&local_80,
                       (AssertionResult *)
                       "CacheEquals(ctx.get(), {collision.get(), sessions[9].get(), sessions[8].get(), sessions[5].get()})"
                       ,"false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_a0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xa97,(char *)local_68._0_8_);
            testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_98);
            goto LAB_0016fc77;
          }
        }
      }
      pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_78;
      pbVar5 = local_78;
    }
    if (pbVar5 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(pdVar6,pbVar5);
    }
    this_00 = &local_70;
LAB_0016f586:
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)this_00);
  }
  std::
  vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
  ::~vector((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
             *)local_38);
LAB_0016f6e2:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_40);
  return;
}

Assistant:

TEST(SSLTest, InternalSessionCache) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);

  // Prepare 10 test sessions.
  std::vector<bssl::UniquePtr<SSL_SESSION>> sessions;
  for (int i = 0; i < 10; i++) {
    bssl::UniquePtr<SSL_SESSION> session = CreateTestSession(i);
    ASSERT_TRUE(session);
    sessions.push_back(std::move(session));
  }

  SSL_CTX_sess_set_cache_size(ctx.get(), 5);

  // Insert all the test sessions.
  for (const auto &session : sessions) {
    ASSERT_TRUE(SSL_CTX_add_session(ctx.get(), session.get()));
  }

  // Only the last five should be in the list.
  ASSERT_TRUE(CacheEquals(
      ctx.get(), {sessions[9].get(), sessions[8].get(), sessions[7].get(),
                  sessions[6].get(), sessions[5].get()}));

  // Inserting an element already in the cache should fail and leave the cache
  // unchanged.
  ASSERT_FALSE(SSL_CTX_add_session(ctx.get(), sessions[7].get()));
  ASSERT_TRUE(CacheEquals(
      ctx.get(), {sessions[9].get(), sessions[8].get(), sessions[7].get(),
                  sessions[6].get(), sessions[5].get()}));

  // Although collisions should be impossible (256-bit session IDs), the cache
  // must handle them gracefully.
  bssl::UniquePtr<SSL_SESSION> collision(CreateTestSession(7));
  ASSERT_TRUE(collision);
  ASSERT_TRUE(SSL_CTX_add_session(ctx.get(), collision.get()));
  ASSERT_TRUE(CacheEquals(
      ctx.get(), {collision.get(), sessions[9].get(), sessions[8].get(),
                  sessions[6].get(), sessions[5].get()}));

  // Removing sessions behaves correctly.
  ASSERT_TRUE(SSL_CTX_remove_session(ctx.get(), sessions[6].get()));
  ASSERT_TRUE(CacheEquals(ctx.get(), {collision.get(), sessions[9].get(),
                                      sessions[8].get(), sessions[5].get()}));

  // Removing sessions requires an exact match.
  ASSERT_FALSE(SSL_CTX_remove_session(ctx.get(), sessions[0].get()));
  ASSERT_FALSE(SSL_CTX_remove_session(ctx.get(), sessions[7].get()));

  // The cache remains unchanged.
  ASSERT_TRUE(CacheEquals(ctx.get(), {collision.get(), sessions[9].get(),
                                      sessions[8].get(), sessions[5].get()}));
}